

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

bool __thiscall
QHttp2ProtocolHandler::sendHEADERS
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,QHttpNetworkRequest *request)

{
  uint uVar1;
  QHttpNetworkRequestPrivate *pQVar2;
  int *piVar3;
  bool bVar4;
  char cVar5;
  ProxyType PVar6;
  HeaderSize HVar7;
  qsizetype qVar8;
  HPack *this_00;
  QNonContiguousByteDevice *pQVar9;
  storage_type *in_R8;
  long i;
  uint uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QLatin1StringView QVar12;
  QByteArrayView QVar13;
  QByteArrayView name;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QByteArrayView value;
  QHttpHeaders requestHeader;
  HttpHeader local_c8;
  QHttpHeaders local_b0;
  QByteArray local_a8;
  QByteArray local_90;
  QByteArray local_78;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PVar6 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0x30) + 8) + 0xc0));
  bVar4 = QHttpNetworkRequest::withCredentials(request);
  if (bVar4) {
    QHttpNetworkConnectionPrivate::createAuthorization
              (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0x30) + 8),
               *(QIODevice **)(this + 0x28),request);
    pQVar2 = (request->d).d.ptr;
    if ((pQVar2 != (QHttpNetworkRequestPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar2->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(&request->d);
    }
    ((request->d).d.ptr)->needResendWithCredentials = false;
  }
  local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  uVar1 = *(uint *)(*(long *)(this + 0x38) + 0x2a4);
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::reserve(&local_58,300);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d._0_4_ = 0xaaaaaaaa;
  local_78.d.d._4_4_ = 0xaaaaaaaa;
  local_78.d.ptr._0_4_ = 0xaaaaaaaa;
  local_78.d.ptr._4_4_ = 0xaaaaaaaa;
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[2])(&local_a8,request);
  QUrl::authority(&local_90,&local_a8,0x1f00006);
  QString::toLatin1_helper_inplace((QString *)&local_78);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)&local_a8);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[11],QByteArray_const&>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [11])":authority",&local_78);
  QHttpNetworkRequest::methodName(&local_90,request);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[8],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [8])":method",&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
    }
  }
  QHttpNetworkRequest::uri(&local_90,request,PVar6 != NoProxy);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[6],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [6])":path",&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
    }
  }
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[2])(&local_b0,request);
  QUrl::scheme();
  QString::toLatin1_helper_inplace((QString *)&local_90);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[8],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [8])":scheme",&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)&local_b0);
  HVar7 = HPack::header_size(&local_58);
  if ((((ulong)HVar7 & 1) == 0) || (uVar11 = (ulong)HVar7 >> 0x20, uVar1 < HVar7.second)) {
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_b0.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[8])(&local_b0);
    qVar8 = QHttpHeaders::size(&local_b0);
    if (0 < qVar8) {
      i = 0;
      do {
        QVar12 = QHttpHeaders::nameAt(&local_b0,i);
        this_00 = (HPack *)QVar12.m_size;
        QVar13 = QHttpHeaders::valueAt(&local_b0,i);
        name.m_data = (storage_type *)QVar13.m_size;
        name.m_size = (qsizetype)QVar12.m_data;
        value.m_data = in_R8;
        value.m_size = (qsizetype)QVar13.m_data;
        HVar7 = HPack::entry_size(this_00,name,value);
        bVar4 = true;
        if (((ulong)HVar7 & 1) != 0) {
          if (((uint)uVar11 <= ~HVar7.second) &&
             (uVar10 = (uint)uVar11 + HVar7.second, uVar11 = (ulong)uVar10, uVar10 <= uVar1)) {
            if (this_00 == (HPack *)0xa) {
              QVar14.m_data = "connection";
              QVar14.m_size = 10;
              cVar5 = QtPrivate::equalStrings(QVar12,QVar14);
              bVar4 = false;
              if (cVar5 != '\0') goto LAB_001f7412;
            }
            if (this_00 == (HPack *)&DAT_00000004) {
              QVar15.m_data = "host";
              QVar15.m_size = 4;
              cVar5 = QtPrivate::equalStrings(QVar12,QVar15);
              bVar4 = false;
              if (cVar5 != '\0') goto LAB_001f7412;
            }
            if (this_00 == (HPack *)0xa) {
              QVar16.m_data = "keep-alive";
              QVar16.m_size = 10;
              cVar5 = QtPrivate::equalStrings(QVar12,QVar16);
              bVar4 = false;
              if (cVar5 != '\0') goto LAB_001f7412;
            }
            if (this_00 == (HPack *)0x11) {
              QVar18.m_data = "transfer-encoding";
              QVar18.m_size = 0x11;
              cVar5 = QtPrivate::equalStrings(QVar12,QVar18);
joined_r0x001f74fa:
              bVar4 = false;
              if (cVar5 != '\0') goto LAB_001f7412;
            }
            else if (this_00 == (HPack *)0x10) {
              QVar17.m_data = "proxy-connection";
              QVar17.m_size = 0x10;
              cVar5 = QtPrivate::equalStrings(QVar12,QVar17);
              goto joined_r0x001f74fa;
            }
            QByteArray::QByteArray(&local_90,QVar12.m_data,(longlong)this_00);
            QByteArray::QByteArray(&local_a8,QVar13.m_data,(longlong)QVar13.m_size);
            std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
            emplace_back<QByteArray,QByteArray>
                      ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
                       &local_90,&local_a8);
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
              }
            }
            if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
              }
            }
            bVar4 = false;
          }
        }
LAB_001f7412:
        if (bVar4) break;
        i = i + 1;
        qVar8 = QHttpHeaders::size(&local_b0);
      } while (i < qVar8);
    }
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    QHttpHeaders::~QHttpHeaders(&local_b0);
  }
  piVar3 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),1,0x10);
    }
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector(&local_58);
  if (local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = false;
  }
  else {
    pQVar9 = QHttpNetworkRequest::uploadByteDevice(request);
    bVar4 = QHttp2Stream::sendHEADERS
                      ((QHttp2Stream *)stream,&local_c8,pQVar9 == (QNonContiguousByteDevice *)0x0,
                       '\x7f');
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QHttp2ProtocolHandler::sendHEADERS(QHttp2Stream *stream, QHttpNetworkRequest &request)
{
    using namespace HPack;

    bool useProxy = false;
#ifndef QT_NO_NETWORKPROXY
    useProxy = m_connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy;
#endif
    if (request.withCredentials()) {
        m_connection->d_func()->createAuthorization(m_socket, request);
        request.d->needResendWithCredentials = false;
    }
    const auto headers = build_headers(request, h2Connection->maxHeaderListSize(), useProxy);
    if (headers.empty()) // nothing fits into maxHeaderListSize
        return false;

    bool mustUploadData = request.uploadByteDevice();
    return stream->sendHEADERS(headers, !mustUploadData);
}